

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O2

bool embree::avx::ConeCurveMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  Geometry *pGVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  uint uVar28;
  byte bVar29;
  bool bVar30;
  undefined1 (*pauVar31) [16];
  Scene *pSVar32;
  ulong uVar33;
  float fVar34;
  float fVar41;
  float fVar42;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar43;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar44;
  undefined8 extraout_XMM1_Qa;
  float fVar54;
  float fVar55;
  float fVar56;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 extraout_var [56];
  float fVar57;
  float fVar68;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar87;
  float fVar88;
  undefined1 auVar85 [16];
  float fVar89;
  undefined1 auVar86 [16];
  float fVar90;
  float fVar91;
  float fVar98;
  float fVar100;
  float fVar102;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar101;
  float fVar103;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar121;
  float fVar122;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar123;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  float fVar128;
  float fVar129;
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [64];
  float fVar139;
  float fVar142;
  float fVar143;
  undefined1 auVar140 [16];
  float fVar144;
  undefined1 auVar141 [16];
  undefined1 auVar145 [16];
  float fVar146;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar147 [16];
  undefined1 auVar148 [64];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [64];
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_328;
  undefined8 local_318;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  Scene *local_2d0;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  RTCHitN local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  uint local_f8;
  uint uStack_f4;
  uint uStack_f0;
  uint uStack_ec;
  uint uStack_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pSVar32 = context->scene;
  uVar28 = (line->v0).field_0.i[0];
  pGVar12 = (pSVar32->geometries).items[line->sharedGeomID].ptr;
  lVar13 = *(long *)&pGVar12[1].time_range.upper;
  p_Var14 = pGVar12[1].intersectionFilterN;
  auVar35 = *(undefined1 (*) [16])(lVar13 + (ulong)uVar28 * (long)p_Var14);
  uVar9 = (line->v0).field_0.i[1];
  auVar39 = *(undefined1 (*) [16])(lVar13 + (ulong)uVar9 * (long)p_Var14);
  uVar10 = (line->v0).field_0.i[2];
  auVar47 = *(undefined1 (*) [16])(lVar13 + (ulong)uVar10 * (long)p_Var14);
  uVar11 = (line->v0).field_0.i[3];
  auVar48 = *(undefined1 (*) [16])(lVar13 + (ulong)uVar11 * (long)p_Var14);
  auVar108 = vunpcklps_avx(auVar35,auVar47);
  auVar35 = vunpckhps_avx(auVar35,auVar47);
  auVar47 = vunpcklps_avx(auVar39,auVar48);
  auVar39 = vunpckhps_avx(auVar39,auVar48);
  auVar62 = vunpcklps_avx(auVar108,auVar47);
  auVar60 = vunpckhps_avx(auVar108,auVar47);
  auVar105 = vunpcklps_avx(auVar35,auVar39);
  auVar61 = vunpckhps_avx(auVar35,auVar39);
  auVar35 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar28 + 1) * (long)p_Var14);
  auVar39 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar9 + 1) * (long)p_Var14);
  auVar47 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar10 + 1) * (long)p_Var14);
  auVar48 = *(undefined1 (*) [16])(lVar13 + (ulong)(uVar11 + 1) * (long)p_Var14);
  auVar108 = vpunpckldq_avx(auVar35,auVar47);
  auVar35 = vpunpckhdq_avx(auVar35,auVar47);
  auVar47 = vpunpckldq_avx(auVar39,auVar48);
  auVar39 = vpunpckhdq_avx(auVar39,auVar48);
  auVar26 = vpunpckldq_avx(auVar108,auVar47);
  auVar47 = vpunpckhdq_avx(auVar108,auVar47);
  auVar108 = vpunpckldq_avx(auVar35,auVar39);
  auVar48 = vpunpckhdq_avx(auVar35,auVar39);
  auVar35 = vpcmpeqd_avx(auVar48,auVar48);
  auVar39 = vpcmpeqd_avx(auVar35,(undefined1  [16])(line->primIDs).field_0);
  local_b8 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  local_c8 = *(float *)(ray + k * 4 + 0x40);
  fVar1 = *(float *)(ray + k * 4 + 0x50);
  fVar2 = *(float *)(ray + k * 4 + 0x60);
  auVar35 = ZEXT416((uint)(local_c8 * local_c8 + fVar1 * fVar1 + fVar2 * fVar2));
  auVar69 = vshufps_avx(auVar35,auVar35,0);
  auVar35 = vrcpps_avx(auVar69);
  fVar44 = auVar35._0_4_;
  auVar36._0_4_ = fVar44 * auVar69._0_4_;
  fVar54 = auVar35._4_4_;
  auVar36._4_4_ = fVar54 * auVar69._4_4_;
  fVar55 = auVar35._8_4_;
  auVar36._8_4_ = fVar55 * auVar69._8_4_;
  fVar56 = auVar35._12_4_;
  auVar36._12_4_ = fVar56 * auVar69._12_4_;
  auVar35._8_4_ = 0x3f800000;
  auVar35._0_8_ = 0x3f8000003f800000;
  auVar35._12_4_ = 0x3f800000;
  auVar35 = vsubps_avx(auVar35,auVar36);
  auVar45._0_4_ = (auVar26._0_4_ + auVar62._0_4_) * 0.5;
  auVar45._4_4_ = (auVar26._4_4_ + auVar62._4_4_) * 0.5;
  auVar45._8_4_ = (auVar26._8_4_ + auVar62._8_4_) * 0.5;
  auVar45._12_4_ = (auVar26._12_4_ + auVar62._12_4_) * 0.5;
  auVar69._0_4_ = (auVar47._0_4_ + auVar60._0_4_) * 0.5;
  auVar69._4_4_ = (auVar47._4_4_ + auVar60._4_4_) * 0.5;
  auVar69._8_4_ = (auVar47._8_4_ + auVar60._8_4_) * 0.5;
  auVar69._12_4_ = (auVar47._12_4_ + auVar60._12_4_) * 0.5;
  auVar58._0_4_ = (auVar105._0_4_ + auVar108._0_4_) * 0.5;
  auVar58._4_4_ = (auVar105._4_4_ + auVar108._4_4_) * 0.5;
  auVar58._8_4_ = (auVar105._8_4_ + auVar108._8_4_) * 0.5;
  auVar58._12_4_ = (auVar105._12_4_ + auVar108._12_4_) * 0.5;
  fVar3 = *(float *)(ray + k * 4 + 0x10);
  auVar85._4_4_ = fVar3;
  auVar85._0_4_ = fVar3;
  auVar85._8_4_ = fVar3;
  auVar85._12_4_ = fVar3;
  auVar69 = vsubps_avx(auVar69,auVar85);
  fVar4 = *(float *)(ray + k * 4 + 0x20);
  auVar104._4_4_ = fVar4;
  auVar104._0_4_ = fVar4;
  auVar104._8_4_ = fVar4;
  auVar104._12_4_ = fVar4;
  auVar36 = vsubps_avx(auVar58,auVar104);
  fVar5 = *(float *)(ray + k * 4);
  auVar70._4_4_ = fVar5;
  auVar70._0_4_ = fVar5;
  auVar70._8_4_ = fVar5;
  auVar70._12_4_ = fVar5;
  auVar45 = vsubps_avx(auVar45,auVar70);
  fVar57 = (local_c8 * auVar45._0_4_ + fVar1 * auVar69._0_4_ + fVar2 * auVar36._0_4_) *
           (fVar44 + fVar44 * auVar35._0_4_);
  fVar68 = (local_c8 * auVar45._4_4_ + fVar1 * auVar69._4_4_ + fVar2 * auVar36._4_4_) *
           (fVar54 + fVar54 * auVar35._4_4_);
  fStack_310 = (local_c8 * auVar45._8_4_ + fVar1 * auVar69._8_4_ + fVar2 * auVar36._8_4_) *
               (fVar55 + fVar55 * auVar35._8_4_);
  fStack_30c = (local_c8 * auVar45._12_4_ + fVar1 * auVar69._12_4_ + fVar2 * auVar36._12_4_) *
               (fVar56 + fVar56 * auVar35._12_4_);
  auVar71._0_4_ = fVar5 + local_c8 * fVar57;
  auVar71._4_4_ = fVar5 + local_c8 * fVar68;
  auVar71._8_4_ = fVar5 + local_c8 * fStack_310;
  auVar71._12_4_ = fVar5 + local_c8 * fStack_30c;
  auVar152._0_4_ = fVar3 + fVar1 * fVar57;
  auVar152._4_4_ = fVar3 + fVar1 * fVar68;
  auVar152._8_4_ = fVar3 + fVar1 * fStack_310;
  auVar152._12_4_ = fVar3 + fVar1 * fStack_30c;
  local_318 = (undefined1 (*) [16])CONCAT44(fVar68,fVar57);
  auVar59._0_4_ = fVar4 + fVar2 * fVar57;
  auVar59._4_4_ = fVar4 + fVar2 * fVar68;
  auVar59._8_4_ = fVar4 + fVar2 * fStack_310;
  auVar59._12_4_ = fVar4 + fVar2 * fStack_30c;
  auVar69 = vsubps_avx(auVar47,auVar60);
  auVar36 = vsubps_avx(auVar108,auVar105);
  fVar3 = auVar36._0_4_;
  fVar55 = auVar36._4_4_;
  fVar18 = auVar36._8_4_;
  fVar22 = auVar36._12_4_;
  fVar4 = auVar69._0_4_;
  fVar56 = auVar69._4_4_;
  fVar19 = auVar69._8_4_;
  fVar23 = auVar69._12_4_;
  auVar45 = vsubps_avx(auVar26,auVar62);
  fVar5 = auVar45._0_4_;
  fVar16 = auVar45._4_4_;
  fVar20 = auVar45._8_4_;
  fVar24 = auVar45._12_4_;
  fVar34 = fVar5 * fVar5 + fVar4 * fVar4 + fVar3 * fVar3;
  fVar41 = fVar16 * fVar16 + fVar56 * fVar56 + fVar55 * fVar55;
  fVar42 = fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18;
  fVar43 = fVar24 * fVar24 + fVar23 * fVar23 + fVar22 * fVar22;
  auVar35 = vsubps_avx(auVar152,auVar60);
  auVar60 = vsubps_avx(auVar59,auVar105);
  fVar44 = auVar60._0_4_;
  fVar17 = auVar60._4_4_;
  fVar21 = auVar60._8_4_;
  fVar25 = auVar60._12_4_;
  fVar146 = auVar35._0_4_;
  fVar149 = auVar35._4_4_;
  fVar150 = auVar35._8_4_;
  fVar151 = auVar35._12_4_;
  local_2e8 = vsubps_avx(auVar71,auVar62);
  fVar128 = local_2e8._0_4_;
  fVar133 = local_2e8._4_4_;
  fVar135 = local_2e8._8_4_;
  fVar137 = local_2e8._12_4_;
  fVar84 = fVar128 * fVar5 + fVar146 * fVar4 + fVar3 * fVar44;
  fVar87 = fVar133 * fVar16 + fVar149 * fVar56 + fVar55 * fVar17;
  fVar88 = fVar135 * fVar20 + fVar150 * fVar19 + fVar18 * fVar21;
  fVar89 = fVar137 * fVar24 + fVar151 * fVar23 + fVar22 * fVar25;
  auVar145._0_4_ = local_c8 * fVar5 + fVar1 * fVar4 + fVar3 * fVar2;
  auVar145._4_4_ = local_c8 * fVar16 + fVar1 * fVar56 + fVar55 * fVar2;
  auVar145._8_4_ = local_c8 * fVar20 + fVar1 * fVar19 + fVar18 * fVar2;
  auVar145._12_4_ = local_c8 * fVar24 + fVar1 * fVar23 + fVar22 * fVar2;
  fStack_c4 = local_c8;
  fStack_c0 = local_c8;
  fStack_bc = local_c8;
  auVar35 = vsubps_avx(auVar61,auVar48);
  fVar54 = auVar35._0_4_;
  fVar121 = auVar35._4_4_;
  fVar122 = auVar35._8_4_;
  fVar123 = auVar35._12_4_;
  fVar90 = fVar54 * fVar54 + fVar34;
  fVar98 = fVar121 * fVar121 + fVar41;
  fVar100 = fVar122 * fVar122 + fVar42;
  fVar102 = fVar123 * fVar123 + fVar43;
  local_d8._0_4_ = fVar34 * fVar34;
  local_d8._4_4_ = fVar41 * fVar41;
  fStack_d0 = fVar42 * fVar42;
  fStack_cc = fVar43 * fVar43;
  auVar60._0_4_ = (float)local_d8._0_4_ * (local_c8 * fVar128 + fVar1 * fVar146 + fVar2 * fVar44);
  auVar60._4_4_ = (float)local_d8._4_4_ * (local_c8 * fVar133 + fVar1 * fVar149 + fVar2 * fVar17);
  auVar60._8_4_ = fStack_d0 * (local_c8 * fVar135 + fVar1 * fVar150 + fVar2 * fVar21);
  auVar60._12_4_ = fStack_cc * (local_c8 * fVar137 + fVar1 * fVar151 + fVar2 * fVar25);
  auVar124._0_4_ = auVar145._0_4_ * fVar84 * fVar90;
  auVar124._4_4_ = auVar145._4_4_ * fVar87 * fVar98;
  auVar124._8_4_ = auVar145._8_4_ * fVar88 * fVar100;
  auVar124._12_4_ = auVar145._12_4_ * fVar89 * fVar102;
  auVar35 = vsubps_avx(auVar60,auVar124);
  fVar91 = auVar61._0_4_;
  auVar125._0_4_ = fVar91 * fVar34;
  fVar99 = auVar61._4_4_;
  auVar125._4_4_ = fVar99 * fVar41;
  fVar101 = auVar61._8_4_;
  auVar125._8_4_ = fVar101 * fVar42;
  fVar103 = auVar61._12_4_;
  auVar125._12_4_ = fVar103 * fVar43;
  auVar147._0_4_ = auVar125._0_4_ * auVar145._0_4_ * fVar54 + auVar35._0_4_;
  auVar147._4_4_ = auVar125._4_4_ * auVar145._4_4_ * fVar121 + auVar35._4_4_;
  auVar147._8_4_ = auVar125._8_4_ * auVar145._8_4_ * fVar122 + auVar35._8_4_;
  auVar147._12_4_ = auVar125._12_4_ * auVar145._12_4_ * fVar123 + auVar35._12_4_;
  auVar61._0_4_ = (float)local_d8._0_4_ * (fVar128 * fVar128 + fVar146 * fVar146 + fVar44 * fVar44);
  auVar61._4_4_ = (float)local_d8._4_4_ * (fVar133 * fVar133 + fVar149 * fVar149 + fVar17 * fVar17);
  auVar61._8_4_ = fStack_d0 * (fVar135 * fVar135 + fVar150 * fVar150 + fVar21 * fVar21);
  auVar61._12_4_ = fStack_cc * (fVar137 * fVar137 + fVar151 * fVar151 + fVar25 * fVar25);
  auVar105._0_4_ = fVar90 * fVar84 * fVar84;
  auVar105._4_4_ = fVar98 * fVar87 * fVar87;
  auVar105._8_4_ = fVar100 * fVar88 * fVar88;
  auVar105._12_4_ = fVar102 * fVar89 * fVar89;
  auVar35 = vsubps_avx(auVar61,auVar105);
  auVar106._0_4_ = (fVar54 + fVar54) * fVar84;
  auVar106._4_4_ = (fVar121 + fVar121) * fVar87;
  auVar106._8_4_ = (fVar122 + fVar122) * fVar88;
  auVar106._12_4_ = (fVar123 + fVar123) * fVar89;
  auVar60 = vsubps_avx(auVar106,auVar125);
  fVar129 = auVar145._0_4_ * auVar145._0_4_;
  fVar134 = auVar145._4_4_ * auVar145._4_4_;
  fVar136 = auVar145._8_4_ * auVar145._8_4_;
  fVar138 = auVar145._12_4_ * auVar145._12_4_;
  auVar62._0_4_ = fVar129 * fVar90;
  auVar62._4_4_ = fVar134 * fVar98;
  auVar62._8_4_ = fVar136 * fVar100;
  auVar62._12_4_ = fVar138 * fVar102;
  auVar61 = vsubps_avx(_local_d8,auVar62);
  auVar107._0_4_ = auVar61._0_4_ * (auVar35._0_4_ + auVar125._0_4_ * auVar60._0_4_);
  auVar107._4_4_ = auVar61._4_4_ * (auVar35._4_4_ + auVar125._4_4_ * auVar60._4_4_);
  auVar107._8_4_ = auVar61._8_4_ * (auVar35._8_4_ + auVar125._8_4_ * auVar60._8_4_);
  auVar107._12_4_ = auVar61._12_4_ * (auVar35._12_4_ + auVar125._12_4_ * auVar60._12_4_);
  auVar126._0_4_ = auVar147._0_4_ * auVar147._0_4_;
  auVar126._4_4_ = auVar147._4_4_ * auVar147._4_4_;
  auVar126._8_4_ = auVar147._8_4_ * auVar147._8_4_;
  auVar126._12_4_ = auVar147._12_4_ * auVar147._12_4_;
  auVar60 = vsubps_avx(auVar126,auVar107);
  auVar105 = ZEXT816(0) << 0x40;
  auVar35 = vcmpps_avx(auVar60,auVar105,5);
  auVar62 = auVar35 & ~auVar39;
  if ((((auVar62 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar62 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar62 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar62[0xf] < '\0') {
    auVar62 = vandnps_avx(auVar39,auVar35);
    auVar58 = vsubps_avx(auVar71,auVar26);
    auVar70 = vsubps_avx(auVar152,auVar47);
    auVar59 = vsubps_avx(auVar59,auVar108);
    auVar39 = vsqrtps_avx(auVar60);
    auVar35 = vrcpps_avx(auVar61);
    fVar139 = auVar35._0_4_;
    auVar140._0_4_ = auVar61._0_4_ * fVar139;
    fVar142 = auVar35._4_4_;
    auVar140._4_4_ = auVar61._4_4_ * fVar142;
    fVar143 = auVar35._8_4_;
    auVar140._8_4_ = auVar61._8_4_ * fVar143;
    fVar144 = auVar35._12_4_;
    auVar140._12_4_ = auVar61._12_4_ * fVar144;
    auVar74._8_4_ = 0x3f800000;
    auVar74._0_8_ = 0x3f8000003f800000;
    auVar74._12_4_ = 0x3f800000;
    auVar35 = vsubps_avx(auVar74,auVar140);
    fVar139 = auVar35._0_4_ * fVar139 + fVar139;
    fVar142 = auVar35._4_4_ * fVar142 + fVar142;
    fVar143 = auVar35._8_4_ * fVar143 + fVar143;
    fVar144 = auVar35._12_4_ * fVar144 + fVar144;
    auVar108._8_4_ = 0x7fffffff;
    auVar108._0_8_ = 0x7fffffff7fffffff;
    auVar108._12_4_ = 0x7fffffff;
    auVar35 = vandps_avx(auVar61,auVar108);
    auVar109._8_4_ = 0x219392ef;
    auVar109._0_8_ = 0x219392ef219392ef;
    auVar109._12_4_ = 0x219392ef;
    auVar35 = vcmpps_avx(auVar35,auVar109,2);
    uVar33 = CONCAT44(auVar147._4_4_,auVar147._0_4_);
    auVar110._0_8_ = uVar33 ^ 0x8000000080000000;
    auVar110._8_4_ = -auVar147._8_4_;
    auVar110._12_4_ = -auVar147._12_4_;
    auVar47 = vsubps_avx(auVar110,auVar39);
    auVar39 = vsubps_avx(auVar39,auVar147);
    auVar111._0_4_ = fVar139 * auVar47._0_4_;
    auVar111._4_4_ = fVar142 * auVar47._4_4_;
    auVar111._8_4_ = fVar143 * auVar47._8_4_;
    auVar111._12_4_ = fVar144 * auVar47._12_4_;
    auVar130._0_4_ = auVar39._0_4_ * fVar139;
    auVar130._4_4_ = auVar39._4_4_ * fVar142;
    auVar130._8_4_ = auVar39._8_4_ * fVar143;
    auVar130._12_4_ = auVar39._12_4_ * fVar144;
    auVar37._8_4_ = 0xff800000;
    auVar37._0_8_ = 0xff800000ff800000;
    auVar37._12_4_ = 0xff800000;
    auVar39 = vblendvps_avx(auVar111,auVar37,auVar35);
    auVar141._8_4_ = 0x7f800000;
    auVar141._0_8_ = 0x7f8000007f800000;
    auVar141._12_4_ = 0x7f800000;
    auVar47 = vblendvps_avx(auVar130,auVar141,auVar35);
    auVar38._0_4_ = auVar145._0_4_ * auVar39._0_4_ + fVar84;
    auVar38._4_4_ = auVar145._4_4_ * auVar39._4_4_ + fVar87;
    auVar38._8_4_ = auVar145._8_4_ * auVar39._8_4_ + fVar88;
    auVar38._12_4_ = auVar145._12_4_ * auVar39._12_4_ + fVar89;
    auVar35 = vcmpps_avx(auVar38,auVar105,6);
    auVar26._4_4_ = fVar41;
    auVar26._0_4_ = fVar34;
    auVar26._8_4_ = fVar42;
    auVar26._12_4_ = fVar43;
    auVar108 = vcmpps_avx(auVar38,auVar26,1);
    auVar35 = vandps_avx(auVar35,auVar108);
    auVar35 = vandps_avx(auVar62,auVar35);
    auVar108 = vblendvps_avx(auVar141,auVar39,auVar35);
    auVar112._0_4_ = fVar84 + auVar145._0_4_ * auVar47._0_4_;
    auVar112._4_4_ = fVar87 + auVar145._4_4_ * auVar47._4_4_;
    auVar112._8_4_ = fVar88 + auVar145._8_4_ * auVar47._8_4_;
    auVar112._12_4_ = fVar89 + auVar145._12_4_ * auVar47._12_4_;
    auVar35 = vcmpps_avx(auVar112,auVar105,6);
    auVar39 = vcmpps_avx(auVar112,auVar26,1);
    auVar35 = vandps_avx(auVar39,auVar35);
    auVar35 = vandps_avx(auVar62,auVar35);
    auVar26 = vblendvps_avx(auVar37,auVar47,auVar35);
    auVar35 = vrcpps_avx(auVar145);
    fVar139 = auVar35._0_4_;
    auVar113._0_4_ = auVar145._0_4_ * fVar139;
    fVar142 = auVar35._4_4_;
    auVar113._4_4_ = auVar145._4_4_ * fVar142;
    fVar143 = auVar35._8_4_;
    auVar113._8_4_ = auVar145._8_4_ * fVar143;
    fVar144 = auVar35._12_4_;
    auVar113._12_4_ = auVar145._12_4_ * fVar144;
    auVar35 = vsubps_avx(auVar74,auVar113);
    fVar139 = fVar139 + fVar139 * auVar35._0_4_;
    fVar142 = fVar142 + fVar142 * auVar35._4_4_;
    fVar143 = fVar143 + fVar143 * auVar35._8_4_;
    fVar144 = fVar144 + fVar144 * auVar35._12_4_;
    auVar92._0_4_ = auVar145._0_4_ * fVar128;
    auVar92._4_4_ = auVar145._4_4_ * fVar133;
    auVar92._8_4_ = auVar145._8_4_ * fVar135;
    auVar92._12_4_ = auVar145._12_4_ * fVar137;
    auVar114._0_4_ = local_c8 * fVar84;
    auVar114._4_4_ = local_c8 * fVar87;
    auVar114._8_4_ = local_c8 * fVar88;
    auVar114._12_4_ = local_c8 * fVar89;
    auVar35 = vsubps_avx(auVar92,auVar114);
    auVar115._0_4_ = auVar145._0_4_ * fVar146;
    auVar115._4_4_ = auVar145._4_4_ * fVar149;
    auVar115._8_4_ = auVar145._8_4_ * fVar150;
    auVar115._12_4_ = auVar145._12_4_ * fVar151;
    auVar153._0_4_ = fVar1 * fVar84;
    auVar153._4_4_ = fVar1 * fVar87;
    auVar153._8_4_ = fVar1 * fVar88;
    auVar153._12_4_ = fVar1 * fVar89;
    auVar39 = vsubps_avx(auVar115,auVar153);
    auVar154._0_4_ = auVar145._0_4_ * fVar44;
    auVar154._4_4_ = auVar145._4_4_ * fVar17;
    auVar154._8_4_ = auVar145._8_4_ * fVar21;
    auVar154._12_4_ = auVar145._12_4_ * fVar25;
    auVar75._0_4_ = fVar2 * fVar84;
    auVar75._4_4_ = fVar2 * fVar87;
    auVar75._8_4_ = fVar2 * fVar88;
    auVar75._12_4_ = fVar2 * fVar89;
    auVar47 = vsubps_avx(auVar154,auVar75);
    auVar76._0_4_ =
         auVar35._0_4_ * auVar35._0_4_ +
         auVar39._0_4_ * auVar39._0_4_ + auVar47._0_4_ * auVar47._0_4_;
    auVar76._4_4_ =
         auVar35._4_4_ * auVar35._4_4_ +
         auVar39._4_4_ * auVar39._4_4_ + auVar47._4_4_ * auVar47._4_4_;
    auVar76._8_4_ =
         auVar35._8_4_ * auVar35._8_4_ +
         auVar39._8_4_ * auVar39._8_4_ + auVar47._8_4_ * auVar47._8_4_;
    auVar76._12_4_ =
         auVar35._12_4_ * auVar35._12_4_ +
         auVar39._12_4_ * auVar39._12_4_ + auVar47._12_4_ * auVar47._12_4_;
    auVar93._0_4_ = fVar91 * fVar91 * fVar129;
    auVar93._4_4_ = fVar99 * fVar99 * fVar134;
    auVar93._8_4_ = fVar101 * fVar101 * fVar136;
    auVar93._12_4_ = fVar103 * fVar103 * fVar138;
    auVar35 = vcmpps_avx(auVar76,auVar93,1);
    auVar94._0_4_ = fVar139 * -fVar84;
    auVar94._4_4_ = fVar142 * -fVar87;
    auVar94._8_4_ = fVar143 * -fVar88;
    auVar94._12_4_ = fVar144 * -fVar89;
    auVar39 = vblendvps_avx(auVar141,auVar94,auVar35);
    local_368._0_4_ = auVar58._0_4_;
    local_368._4_4_ = auVar58._4_4_;
    fStack_360 = auVar58._8_4_;
    fStack_35c = auVar58._12_4_;
    fVar84 = (float)local_368._0_4_ * fVar5 + auVar70._0_4_ * fVar4 + auVar59._0_4_ * fVar3;
    fVar87 = (float)local_368._4_4_ * fVar16 + auVar70._4_4_ * fVar56 + auVar59._4_4_ * fVar55;
    fVar88 = fStack_360 * fVar20 + auVar70._8_4_ * fVar19 + auVar59._8_4_ * fVar18;
    fVar89 = fStack_35c * fVar24 + auVar70._12_4_ * fVar23 + auVar59._12_4_ * fVar22;
    auVar35 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar62);
    auVar60 = vblendvps_avx(auVar141,auVar39,auVar35);
    auVar39._0_4_ = auVar145._0_4_ * (float)local_368._0_4_;
    auVar39._4_4_ = auVar145._4_4_ * (float)local_368._4_4_;
    auVar39._8_4_ = auVar145._8_4_ * fStack_360;
    auVar39._12_4_ = auVar145._12_4_ * fStack_35c;
    auVar72._0_4_ = auVar145._0_4_ * auVar70._0_4_;
    auVar72._4_4_ = auVar145._4_4_ * auVar70._4_4_;
    auVar72._8_4_ = auVar145._8_4_ * auVar70._8_4_;
    auVar72._12_4_ = auVar145._12_4_ * auVar70._12_4_;
    auVar46._0_4_ = auVar145._0_4_ * auVar59._0_4_;
    auVar46._4_4_ = auVar145._4_4_ * auVar59._4_4_;
    auVar46._8_4_ = auVar145._8_4_ * auVar59._8_4_;
    auVar46._12_4_ = auVar145._12_4_ * auVar59._12_4_;
    auVar77._0_4_ = local_c8 * fVar84;
    auVar77._4_4_ = local_c8 * fVar87;
    auVar77._8_4_ = local_c8 * fVar88;
    auVar77._12_4_ = local_c8 * fVar89;
    auVar39 = vsubps_avx(auVar39,auVar77);
    auVar78._0_4_ = fVar1 * fVar84;
    auVar78._4_4_ = fVar1 * fVar87;
    auVar78._8_4_ = fVar1 * fVar88;
    auVar78._12_4_ = fVar1 * fVar89;
    auVar47 = vsubps_avx(auVar72,auVar78);
    auVar79._0_4_ = fVar2 * fVar84;
    auVar79._4_4_ = fVar2 * fVar87;
    auVar79._8_4_ = fVar2 * fVar88;
    auVar79._12_4_ = fVar2 * fVar89;
    auVar61 = vsubps_avx(auVar46,auVar79);
    auVar35 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar62);
    auVar40._0_4_ =
         auVar39._0_4_ * auVar39._0_4_ +
         auVar47._0_4_ * auVar47._0_4_ + auVar61._0_4_ * auVar61._0_4_;
    auVar40._4_4_ =
         auVar39._4_4_ * auVar39._4_4_ +
         auVar47._4_4_ * auVar47._4_4_ + auVar61._4_4_ * auVar61._4_4_;
    auVar40._8_4_ =
         auVar39._8_4_ * auVar39._8_4_ +
         auVar47._8_4_ * auVar47._8_4_ + auVar61._8_4_ * auVar61._8_4_;
    auVar40._12_4_ =
         auVar39._12_4_ * auVar39._12_4_ +
         auVar47._12_4_ * auVar47._12_4_ + auVar61._12_4_ * auVar61._12_4_;
    local_2f8._0_4_ = auVar48._0_4_;
    local_2f8._4_4_ = auVar48._4_4_;
    fStack_2f0 = auVar48._8_4_;
    fStack_2ec = auVar48._12_4_;
    auVar47._0_4_ = (float)local_2f8._0_4_ * (float)local_2f8._0_4_ * fVar129;
    auVar47._4_4_ = (float)local_2f8._4_4_ * (float)local_2f8._4_4_ * fVar134;
    auVar47._8_4_ = fStack_2f0 * fStack_2f0 * fVar136;
    auVar47._12_4_ = fStack_2ec * fStack_2ec * fVar138;
    auVar39 = vcmpps_avx(auVar40,auVar47,1);
    auVar48._0_4_ = fVar139 * -fVar84;
    auVar48._4_4_ = fVar142 * -fVar87;
    auVar48._8_4_ = fVar143 * -fVar88;
    auVar48._12_4_ = fVar144 * -fVar89;
    auVar39 = vblendvps_avx(auVar141,auVar48,auVar39);
    auVar35 = vblendvps_avx(auVar141,auVar39,auVar35);
    auVar48 = vminps_avx(auVar60,auVar35);
    auVar39 = vmaxps_avx(auVar60,auVar35);
    auVar61 = vminps_avx(auVar108,auVar48);
    auVar47 = vcmpps_avx(auVar61,auVar48,0);
    auVar35 = vcmpps_avx(auVar141,auVar39,0);
    auVar95._8_4_ = 0xff800000;
    auVar95._0_8_ = 0xff800000ff800000;
    auVar95._12_4_ = 0xff800000;
    auVar35 = vblendvps_avx(auVar39,auVar95,auVar35);
    auVar39 = vcmpps_avx(auVar141,auVar48,0);
    auVar39 = vblendvps_avx(auVar48,auVar95,auVar39);
    auVar35 = vblendvps_avx(auVar39,auVar35,auVar47);
    uVar6 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar63._4_4_ = uVar6;
    auVar63._0_4_ = uVar6;
    auVar63._8_4_ = uVar6;
    auVar63._12_4_ = uVar6;
    local_338 = vmaxps_avx(auVar26,auVar35);
    auVar49._0_4_ = fVar57 + auVar61._0_4_;
    auVar49._4_4_ = fVar68 + auVar61._4_4_;
    auVar49._8_4_ = fStack_310 + auVar61._8_4_;
    auVar49._12_4_ = fStack_30c + auVar61._12_4_;
    auVar35 = vcmpps_avx(auVar63,auVar49,2);
    uVar6 = *(undefined4 *)(ray + k * 4 + 0x80);
    local_368._4_4_ = uVar6;
    local_368._0_4_ = uVar6;
    fStack_360 = (float)uVar6;
    fStack_35c = (float)uVar6;
    auVar39 = vcmpps_avx(auVar49,_local_368,2);
    auVar35 = vandps_avx(auVar35,auVar39);
    auVar39 = vcmpps_avx(auVar141,auVar61,4);
    local_48 = vandps_avx(auVar35,auVar39);
    auVar35 = vandps_avx(local_48,auVar62);
    local_328._0_4_ = local_338._0_4_ + fVar57;
    local_328._4_4_ = local_338._4_4_ + fVar68;
    local_328._8_4_ = local_338._8_4_ + fStack_310;
    local_328._12_4_ = local_338._12_4_ + fStack_30c;
    auVar39 = vcmpps_avx(auVar63,(undefined1  [16])local_328,2);
    auVar47 = vcmpps_avx((undefined1  [16])local_328,_local_368,2);
    auVar39 = vandps_avx(auVar39,auVar47);
    auVar47 = vcmpps_avx(local_338,auVar95,4);
    auVar47 = vandps_avx(auVar62,auVar47);
    local_58 = vandps_avx(auVar39,auVar47);
    auVar39 = vorps_avx(auVar35,local_58);
    uVar28 = vmovmskps_avx(auVar39);
    if (uVar28 != 0) {
      auVar47 = vblendvps_avx(local_338,auVar61,auVar35);
      auVar48 = vblendvps_avx(auVar112,auVar38,auVar35);
      auVar27._4_4_ = fVar41;
      auVar27._0_4_ = fVar34;
      auVar27._8_4_ = fVar42;
      auVar27._12_4_ = fVar43;
      auVar35 = vrcpps_avx(auVar27);
      local_308 = auVar35._0_4_;
      auVar73._0_4_ = fVar34 * local_308;
      fStack_304 = auVar35._4_4_;
      auVar73._4_4_ = fVar41 * fStack_304;
      fStack_300 = auVar35._8_4_;
      auVar73._8_4_ = fVar42 * fStack_300;
      fStack_2fc = auVar35._12_4_;
      auVar73._12_4_ = fVar43 * fStack_2fc;
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = 0x3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar35 = vsubps_avx(auVar131,auVar73);
      local_308 = local_308 + local_308 * auVar35._0_4_;
      fStack_304 = fStack_304 + fStack_304 * auVar35._4_4_;
      fStack_300 = fStack_300 + fStack_300 * auVar35._8_4_;
      fStack_2fc = fStack_2fc + fStack_2fc * auVar35._12_4_;
      fVar91 = fVar34 * fVar54 * fVar91;
      fVar99 = fVar41 * fVar121 * fVar99;
      fVar101 = fVar42 * fVar122 * fVar101;
      fVar103 = fVar43 * fVar123 * fVar103;
      auVar35 = vcmpps_avx(auVar47,auVar108,0);
      auVar39 = vcmpps_avx(auVar26,auVar47,0);
      auVar35 = vorps_avx(auVar35,auVar39);
      auVar35 = vandps_avx(auVar62,auVar35);
      auVar39 = vcmpps_avx(auVar47,auVar60,0);
      auVar39 = vandps_avx(auVar62,auVar39);
      fVar54 = auVar47._0_4_;
      fVar121 = auVar47._4_4_;
      fVar122 = auVar47._8_4_;
      fVar123 = auVar47._12_4_;
      fStack_344 = fVar16 * fVar99;
      local_348 = fVar5 * fVar91;
      fStack_340 = fVar20 * fVar101;
      fStack_33c = fVar24 * fVar103;
      auVar64._0_4_ = fVar5 * fVar91 + (float)local_d8._0_4_ * (local_c8 * fVar54 + fVar128);
      auVar64._4_4_ = fVar16 * fVar99 + (float)local_d8._4_4_ * (local_c8 * fVar121 + fVar133);
      auVar64._8_4_ = fVar20 * fVar101 + fStack_d0 * (local_c8 * fVar122 + fVar135);
      auVar64._12_4_ = fVar24 * fVar103 + fStack_cc * (local_c8 * fVar123 + fVar137);
      fVar34 = auVar48._0_4_;
      auVar80._0_4_ = fVar34 * fVar5 * fVar90;
      fVar41 = auVar48._4_4_;
      auVar80._4_4_ = fVar41 * fVar16 * fVar98;
      fVar42 = auVar48._8_4_;
      auVar80._8_4_ = fVar42 * fVar20 * fVar100;
      fVar43 = auVar48._12_4_;
      auVar80._12_4_ = fVar43 * fVar24 * fVar102;
      auVar48 = vsubps_avx(auVar64,auVar80);
      auVar81._0_4_ = fVar4 * fVar91 + (float)local_d8._0_4_ * (fVar146 + fVar1 * fVar54);
      auVar81._4_4_ = fVar56 * fVar99 + (float)local_d8._4_4_ * (fVar149 + fVar1 * fVar121);
      auVar81._8_4_ = fVar19 * fVar101 + fStack_d0 * (fVar150 + fVar1 * fVar122);
      auVar81._12_4_ = fVar23 * fVar103 + fStack_cc * (fVar151 + fVar1 * fVar123);
      auVar116._0_4_ = fVar4 * fVar90 * fVar34;
      auVar116._4_4_ = fVar56 * fVar98 * fVar41;
      auVar116._8_4_ = fVar19 * fVar100 * fVar42;
      auVar116._12_4_ = fVar23 * fVar102 * fVar43;
      auVar61 = vsubps_avx(auVar81,auVar116);
      local_88._0_8_ = auVar45._0_8_ ^ 0x8000000080000000;
      local_88._8_4_ = -fVar20;
      local_88._12_4_ = -fVar24;
      auVar47 = vblendvps_avx(auVar45,local_88,auVar39);
      hit.vNg.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar47,auVar48,auVar35);
      local_68 = fVar3 * fVar91;
      fStack_64 = fVar55 * fVar99;
      fStack_60 = fVar18 * fVar101;
      fStack_5c = fVar22 * fVar103;
      auVar96._0_4_ = fVar3 * fVar91 + (float)local_d8._0_4_ * (fVar44 + fVar54 * fVar2);
      auVar96._4_4_ = fVar55 * fVar99 + (float)local_d8._4_4_ * (fVar17 + fVar121 * fVar2);
      auVar96._8_4_ = fVar18 * fVar101 + fStack_d0 * (fVar21 + fVar122 * fVar2);
      auVar96._12_4_ = fVar22 * fVar103 + fStack_cc * (fVar25 + fVar123 * fVar2);
      auVar117._0_4_ = fVar34 * fVar3 * fVar90;
      auVar117._4_4_ = fVar41 * fVar55 * fVar98;
      auVar117._8_4_ = fVar42 * fVar18 * fVar100;
      auVar117._12_4_ = fVar43 * fVar22 * fVar102;
      local_98._0_8_ = auVar69._0_8_ ^ 0x8000000080000000;
      local_98._8_4_ = -fVar19;
      local_98._12_4_ = -fVar23;
      auVar47 = vblendvps_avx(auVar69,local_98,auVar39);
      auVar48 = vsubps_avx(auVar96,auVar117);
      hit.vNg.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar47,auVar61,auVar35);
      local_a8._0_8_ = auVar36._0_8_ ^ 0x8000000080000000;
      local_a8._8_4_ = -fVar18;
      local_a8._12_4_ = -fVar22;
      auVar47 = vblendvps_avx(auVar36,local_a8,auVar39);
      hit.vNg.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar47,auVar48,auVar35);
      auVar50._8_4_ = 0x3f800000;
      auVar50._0_8_ = 0x3f8000003f800000;
      auVar50._12_4_ = 0x3f800000;
      local_78 = vandnps_avx(auVar39,auVar50);
      auVar51._0_4_ = fVar34 * local_308;
      auVar51._4_4_ = fVar41 * fStack_304;
      auVar51._8_4_ = fVar42 * fStack_300;
      auVar51._12_4_ = fVar43 * fStack_2fc;
      hit.vu.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(local_78,auVar51,auVar35);
      auVar155 = ZEXT1664(ZEXT816(0));
      hit.vv.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)ZEXT816(0);
      hit.vt.field_0.v[1] = fVar121 + fVar68;
      hit.vt.field_0.v[0] = fVar54 + fVar57;
      hit.vt.field_0.v[2] = fVar122 + fStack_310;
      hit.vt.field_0.v[3] = fVar123 + fStack_30c;
      uVar33 = (ulong)(uVar28 & 0xff);
      pauVar31 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar148 = ZEXT1664(local_2e8);
      _local_2f8 = auVar108;
      do {
        args.hit = local_168;
        auVar35 = auVar148._0_16_;
        uVar15 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar28 = *(uint *)(local_b8 + uVar15 * 4);
        pGVar12 = (pSVar32->geometries).items[uVar28].ptr;
        args.ray = (RTCRayN *)ray;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar30 = true, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_0076b364;
          uVar7 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x60);
          local_138._4_4_ = uVar7;
          local_138._0_4_ = uVar7;
          local_138._8_4_ = uVar7;
          local_138._12_4_ = uVar7;
          uVar7 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x50);
          auVar65._4_4_ = uVar7;
          auVar65._0_4_ = uVar7;
          auVar65._8_4_ = uVar7;
          auVar65._12_4_ = uVar7;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_168 + uVar15 * 4 + -0x40);
          args.context = context->user;
          local_108 = vpshufd_avx(ZEXT416(uVar28),0);
          uVar28 = (line->primIDs).field_0.i[uVar15];
          local_118._4_4_ = uVar28;
          local_118._0_4_ = uVar28;
          local_118._8_4_ = uVar28;
          local_118._12_4_ = uVar28;
          uVar7 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x30);
          uVar8 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x20);
          local_158._4_4_ = uVar8;
          local_158._0_4_ = uVar8;
          local_158._8_4_ = uVar8;
          local_158._12_4_ = uVar8;
          uVar8 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x10);
          local_148._4_4_ = uVar8;
          local_148._0_4_ = uVar8;
          local_148._8_4_ = uVar8;
          local_148._12_4_ = uVar8;
          local_168[0] = (RTCHitN)(char)uVar7;
          local_168[1] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_168[2] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_168[3] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_168[4] = (RTCHitN)(char)uVar7;
          local_168[5] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_168[6] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_168[7] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_168[8] = (RTCHitN)(char)uVar7;
          local_168[9] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_168[10] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_168[0xb] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_168[0xc] = (RTCHitN)(char)uVar7;
          local_168[0xd] = (RTCHitN)(char)((uint)uVar7 >> 8);
          local_168[0xe] = (RTCHitN)(char)((uint)uVar7 >> 0x10);
          local_168[0xf] = (RTCHitN)(char)((uint)uVar7 >> 0x18);
          local_128 = auVar65;
          auVar127 = vcmpps_avx(ZEXT1632(local_138),ZEXT1632(local_138),0xf);
          auVar35 = auVar127._0_16_;
          uStack_f4 = (args.context)->instID[0];
          local_f8 = uStack_f4;
          uStack_f0 = uStack_f4;
          uStack_ec = uStack_f4;
          uStack_e8 = (args.context)->instPrimID[0];
          uStack_e4 = uStack_e8;
          uStack_e0 = uStack_e8;
          uStack_dc = uStack_e8;
          local_358 = *pauVar31;
          args.geometryUserPtr = pGVar12->userPtr;
          args.N = 4;
          local_2d0 = pSVar32;
          args.valid = (int *)local_358;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_318 = pauVar31;
            (*pGVar12->occlusionFilterN)(&args);
            auVar148._8_56_ = extraout_var;
            auVar148._0_8_ = extraout_XMM1_Qa;
            auVar35 = auVar148._0_16_;
            auVar155 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar148 = ZEXT1664(local_2e8);
            pauVar31 = local_318;
          }
          if (local_358 == (undefined1  [16])0x0) {
            auVar39 = vpcmpeqd_avx(auVar155._0_16_,(undefined1  [16])0x0);
            auVar35 = vpcmpeqd_avx(auVar35,auVar35);
            auVar39 = auVar39 ^ auVar35;
          }
          else {
            p_Var14 = context->args->filter;
            auVar39 = vpcmpeqd_avx(auVar65,auVar65);
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var14)(&args);
              auVar39 = vpcmpeqd_avx(auVar39,auVar39);
              auVar155 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar148 = ZEXT1664(local_2e8);
            }
            auVar35 = vpcmpeqd_avx(auVar155._0_16_,local_358);
            auVar39 = auVar35 ^ auVar39;
            auVar66._8_4_ = 0xff800000;
            auVar66._0_8_ = 0xff800000ff800000;
            auVar66._12_4_ = 0xff800000;
            auVar35 = vblendvps_avx(auVar66,*(undefined1 (*) [16])(args.ray + 0x80),auVar35);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar35;
          }
          auVar35 = auVar148._0_16_;
          auVar52._8_8_ = 0x100000001;
          auVar52._0_8_ = 0x100000001;
          if ((auVar52 & auVar39) != (undefined1  [16])0x0) {
            _local_368 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            bVar30 = true;
            goto LAB_0076b364;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = uVar6;
          pSVar32 = local_2d0;
        }
        auVar35 = auVar148._0_16_;
        uVar33 = uVar33 ^ 1L << (uVar15 & 0x3f);
      } while (uVar33 != 0);
      bVar30 = false;
LAB_0076b364:
      local_318 = pauVar31;
      auVar39 = vpermilps_avx(_local_368,0);
      auVar47 = vcmpps_avx((undefined1  [16])local_328,auVar39,2);
      auVar39 = vandps_avx(local_58,local_48);
      auVar39 = vandps_avx(auVar39,auVar47);
      uVar28 = vmovmskps_avx(auVar39);
      if (uVar28 == 0) {
        return bVar30;
      }
      auVar48 = vcmpps_avx(local_338,auVar60,0);
      auVar39 = vblendvps_avx(auVar45,local_88,auVar48);
      auVar47 = vblendvps_avx(auVar69,local_98,auVar48);
      auVar48 = vblendvps_avx(auVar36,local_a8,auVar48);
      auVar108 = vcmpps_avx(local_338,_local_2f8,0);
      auVar26 = vcmpps_avx(local_338,auVar26,0);
      auVar108 = vorps_avx(auVar108,auVar26);
      fVar54 = local_338._0_4_;
      fVar121 = local_338._4_4_;
      fVar122 = local_338._8_4_;
      fVar123 = local_338._12_4_;
      auVar82._0_4_ = (float)local_d8._0_4_ * (auVar35._0_4_ + fVar54 * local_c8) + local_348;
      auVar82._4_4_ = (float)local_d8._4_4_ * (auVar35._4_4_ + fVar121 * fStack_c4) + fStack_344;
      auVar82._8_4_ = fStack_d0 * (auVar35._8_4_ + fVar122 * fStack_c0) + fStack_340;
      auVar82._12_4_ = fStack_cc * (auVar35._12_4_ + fVar123 * fStack_bc) + fStack_33c;
      auVar86._0_4_ = (float)local_d8._0_4_ * (fVar146 + fVar54 * fVar1) + fVar4 * fVar91;
      auVar86._4_4_ = (float)local_d8._4_4_ * (fVar149 + fVar121 * fVar1) + fVar56 * fVar99;
      auVar86._8_4_ = fStack_d0 * (fVar150 + fVar122 * fVar1) + fVar19 * fVar101;
      auVar86._12_4_ = fStack_cc * (fVar151 + fVar123 * fVar1) + fVar23 * fVar103;
      auVar97._0_4_ = (float)local_d8._0_4_ * (fVar44 + fVar54 * fVar2) + local_68;
      auVar97._4_4_ = (float)local_d8._4_4_ * (fVar17 + fVar121 * fVar2) + fStack_64;
      auVar97._8_4_ = fStack_d0 * (fVar21 + fVar122 * fVar2) + fStack_60;
      auVar97._12_4_ = fStack_cc * (fVar25 + fVar123 * fVar2) + fStack_5c;
      auVar118._0_4_ = auVar112._0_4_ * fVar5 * fVar90;
      auVar118._4_4_ = auVar112._4_4_ * fVar16 * fVar98;
      auVar118._8_4_ = auVar112._8_4_ * fVar20 * fVar100;
      auVar118._12_4_ = auVar112._12_4_ * fVar24 * fVar102;
      auVar35 = vsubps_avx(auVar82,auVar118);
      auVar119._0_4_ = auVar112._0_4_ * fVar4 * fVar90;
      auVar119._4_4_ = auVar112._4_4_ * fVar56 * fVar98;
      auVar119._8_4_ = auVar112._8_4_ * fVar19 * fVar100;
      auVar119._12_4_ = auVar112._12_4_ * fVar23 * fVar102;
      auVar26 = vsubps_avx(auVar86,auVar119);
      auVar120._0_4_ = auVar112._0_4_ * fVar3 * fVar90;
      auVar120._4_4_ = auVar112._4_4_ * fVar55 * fVar98;
      auVar120._8_4_ = auVar112._8_4_ * fVar18 * fVar100;
      auVar120._12_4_ = auVar112._12_4_ * fVar22 * fVar102;
      auVar36 = vsubps_avx(auVar97,auVar120);
      hit.vNg.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar39,auVar35,auVar108);
      hit.vNg.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar47,auVar26,auVar108);
      hit.vNg.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar48,auVar36,auVar108);
      auVar83._0_4_ = auVar112._0_4_ * local_308;
      auVar83._4_4_ = auVar112._4_4_ * fStack_304;
      auVar83._8_4_ = auVar112._8_4_ * fStack_300;
      auVar83._12_4_ = auVar112._12_4_ * fStack_2fc;
      hit.vu.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(local_78,auVar83,auVar108);
      auVar148 = ZEXT464(0) << 0x20;
      hit.vv.field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(ZEXT416(0) << 0x20);
      hit.vt.field_0 = local_328;
      pSVar32 = context->scene;
      uVar33 = (ulong)(uVar28 & 0xff);
      auVar127 = vcmpps_avx(ZEXT1632(auVar112),ZEXT1632(auVar112),0xf);
      auVar155 = ZEXT3264(auVar127);
      auVar35 = vpcmpeqd_avx(auVar69,auVar69);
      auVar132 = ZEXT1664(auVar35);
      do {
        args.hit = local_168;
        args.valid = (int *)local_358;
        uVar15 = 0;
        if (uVar33 != 0) {
          for (; (uVar33 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
          }
        }
        uVar28 = *(uint *)(local_b8 + uVar15 * 4);
        pGVar12 = (pSVar32->geometries).items[uVar28].ptr;
        if ((pGVar12->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar29 = 1, pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_0076b758;
          local_138._4_4_ = *(undefined4 *)(local_168 + uVar15 * 4 + -0x60);
          uVar6 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x50);
          local_128._4_4_ = uVar6;
          local_128._0_4_ = uVar6;
          local_128._8_4_ = uVar6;
          local_128._12_4_ = uVar6;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_168 + uVar15 * 4 + -0x40);
          args.context = context->user;
          local_108 = vpshufd_avx(ZEXT416(uVar28),0);
          uVar28 = (line->primIDs).field_0.i[uVar15];
          local_118._4_4_ = uVar28;
          local_118._0_4_ = uVar28;
          local_118._8_4_ = uVar28;
          local_118._12_4_ = uVar28;
          uVar6 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x30);
          uVar7 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x20);
          local_158._4_4_ = uVar7;
          local_158._0_4_ = uVar7;
          local_158._8_4_ = uVar7;
          local_158._12_4_ = uVar7;
          uVar7 = *(undefined4 *)(local_168 + uVar15 * 4 + -0x10);
          local_148._4_4_ = uVar7;
          local_148._0_4_ = uVar7;
          local_148._8_4_ = uVar7;
          local_148._12_4_ = uVar7;
          local_168[0] = (RTCHitN)(char)uVar6;
          local_168[1] = (RTCHitN)(char)((uint)uVar6 >> 8);
          local_168[2] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
          local_168[3] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
          local_168[4] = (RTCHitN)(char)uVar6;
          local_168[5] = (RTCHitN)(char)((uint)uVar6 >> 8);
          local_168[6] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
          local_168[7] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
          local_168[8] = (RTCHitN)(char)uVar6;
          local_168[9] = (RTCHitN)(char)((uint)uVar6 >> 8);
          local_168[10] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
          local_168[0xb] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
          local_168[0xc] = (RTCHitN)(char)uVar6;
          local_168[0xd] = (RTCHitN)(char)((uint)uVar6 >> 8);
          local_168[0xe] = (RTCHitN)(char)((uint)uVar6 >> 0x10);
          local_168[0xf] = (RTCHitN)(char)((uint)uVar6 >> 0x18);
          local_138._0_4_ = local_138._4_4_;
          local_138._8_4_ = local_138._4_4_;
          local_138._12_4_ = local_138._4_4_;
          uStack_f4 = (args.context)->instID[0];
          local_f8 = uStack_f4;
          uStack_f0 = uStack_f4;
          uStack_ec = uStack_f4;
          uStack_e8 = (args.context)->instPrimID[0];
          uStack_e4 = uStack_e8;
          uStack_e0 = uStack_e8;
          uStack_dc = uStack_e8;
          local_358 = *local_318;
          args.geometryUserPtr = pGVar12->userPtr;
          args.N = 4;
          args.ray = (RTCRayN *)ray;
          if (pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar127 = ZEXT1632(auVar155._0_16_);
            auVar35 = auVar132._0_16_;
            (*pGVar12->occlusionFilterN)(&args);
            auVar35 = vpcmpeqd_avx(auVar35,auVar35);
            auVar132 = ZEXT1664(auVar35);
            auVar127 = vcmpps_avx(auVar127,auVar127,0xf);
            auVar155 = ZEXT3264(auVar127);
            auVar148 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar35 = auVar132._0_16_;
          if (local_358 == (undefined1  [16])0x0) {
            auVar39 = vpcmpeqd_avx((undefined1  [16])0x0,auVar148._0_16_);
            auVar35 = auVar35 ^ auVar39;
          }
          else {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar12->field_8).field_0x2 & 0x40) != 0)))) {
              auVar127 = ZEXT1632(auVar155._0_16_);
              (*p_Var14)(&args);
              auVar35 = vpcmpeqd_avx(auVar35,auVar35);
              auVar132 = ZEXT1664(auVar35);
              auVar127 = vcmpps_avx(auVar127,auVar127,0xf);
              auVar155 = ZEXT3264(auVar127);
              auVar148 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar39 = vpcmpeqd_avx(local_358,auVar148._0_16_);
            auVar35 = auVar132._0_16_ ^ auVar39;
            auVar67._8_4_ = 0xff800000;
            auVar67._0_8_ = 0xff800000ff800000;
            auVar67._12_4_ = 0xff800000;
            auVar39 = vblendvps_avx(auVar67,*(undefined1 (*) [16])(args.ray + 0x80),auVar39);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar39;
          }
          auVar53._8_8_ = 0x100000001;
          auVar53._0_8_ = 0x100000001;
          if ((auVar53 & auVar35) != (undefined1  [16])0x0) {
            bVar29 = 1;
            goto LAB_0076b758;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = local_368._0_4_;
        }
        uVar33 = uVar33 ^ 1L << (uVar15 & 0x3f);
        if (uVar33 == 0) {
          bVar29 = 0;
LAB_0076b758:
          return (bool)(bVar30 | bVar29);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }